

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_resolve(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  BOOL BVar4;
  undefined4 in_register_0000000c;
  JSRefCountHeader *p;
  JSValue func_obj;
  JSValue v;
  JSValue v_00;
  JSValue JVar5;
  JSValue JVar6;
  JSValue JVar7;
  JSValue resolving_funcs [2];
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  if ((int)this_val.tag != -1) {
    JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  if ((((magic == 0) && (iVar2 = argv->tag, (int)iVar2 == -1)) &&
      (JVar3 = (JSValueUnion)(argv->u).ptr, *(short *)((long)JVar3.ptr + 6) == 0x2a)) &&
     (*(long *)((long)JVar3.ptr + 0x30) != 0)) {
    JVar5.tag = iVar2;
    JVar5.u.ptr = JVar3.ptr;
    JVar6.tag = iVar2;
    JVar6.u.ptr = JVar3.ptr;
    JVar5 = JS_GetPropertyInternal(ctx,JVar5,0x3c,JVar6,0);
    if ((uint)JVar5.tag == 6) {
      return JVar5;
    }
    BVar4 = js_same_value(ctx,JVar5,this_val);
    if ((0xfffffff4 < (uint)JVar5.tag) &&
       (iVar1 = *JVar5.u.ptr, *(int *)JVar5.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar5);
    }
    if (BVar4 != 0) {
      JVar5 = *argv;
      if ((uint)argv->tag < 0xfffffff5) {
        return *argv;
      }
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
      return JVar5;
    }
  }
  JVar6 = js_new_promise_capability(ctx,(JSValue *)&local_68,this_val);
  JVar5 = JVar6;
  if ((uint)JVar6.tag != 6) {
    local_40 = 0;
    uStack_38 = 3;
    JVar7.tag = 3;
    JVar7.u.ptr = (void *)((ulong)uStack_3c << 0x20);
    func_obj.tag = (&local_60)[(long)magic * 2];
    func_obj.u.ptr = (&local_68)[(long)magic * 2].ptr;
    JVar7 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),JVar7,1,argv,2);
    if ((0xfffffff4 < (uint)local_60) &&
       (iVar1 = *local_68.ptr, *(int *)local_68.ptr = iVar1 + -1, iVar1 < 2)) {
      v.tag = local_60;
      v.u.ptr = local_68.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    if ((0xfffffff4 < (uint)local_50) &&
       (iVar1 = *local_58.ptr, *(int *)local_58.ptr = iVar1 + -1, iVar1 < 2)) {
      v_00.tag = local_50;
      v_00.u.ptr = local_58.ptr;
      __JS_FreeValueRT(ctx->rt,v_00);
    }
    if ((uint)JVar7.tag == 6) {
      JVar5 = JVar7;
      if ((0xfffffff4 < (uint)JVar6.tag) &&
         (iVar1 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
    }
    else if ((0xfffffff4 < (uint)JVar7.tag) &&
            (iVar1 = *JVar7.u.ptr, *(int *)JVar7.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar7);
    }
  }
  return JVar5;
}

Assistant:

static JSValue js_promise_resolve(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue result_promise, resolving_funcs[2], ret;
    BOOL is_reject = magic;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (!is_reject && JS_GetOpaque(argv[0], JS_CLASS_PROMISE)) {
        JSValue ctor;
        BOOL is_same;
        ctor = JS_GetProperty(ctx, argv[0], JS_ATOM_constructor);
        if (JS_IsException(ctor))
            return ctor;
        is_same = js_same_value(ctx, ctor, this_val);
        JS_FreeValue(ctx, ctor);
        if (is_same)
            return JS_DupValue(ctx, argv[0]);
    }
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    ret = JS_Call(ctx, resolving_funcs[is_reject], JS_UNDEFINED, 1, argv);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    if (JS_IsException(ret)) {
        JS_FreeValue(ctx, result_promise);
        return ret;
    }
    JS_FreeValue(ctx, ret);
    return result_promise;
}